

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O3

bool __thiscall CCoinsViewCache::HaveInputs(CCoinsViewCache *this,CTransaction *tx)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  pointer pCVar6;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = CTransaction::IsCoinBase(tx);
  cVar4 = '\x01';
  if ((!bVar3) &&
     (pCVar6 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start,
     (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_finish != pCVar6)) {
    uVar8 = 0;
    uVar7 = 1;
    do {
      iVar5 = (*(this->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])
                        (this,pCVar6 + uVar8);
      cVar4 = (char)iVar5;
      if (cVar4 == '\0') break;
      pCVar6 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar6 >> 3) * 0x4ec4ec4ec4ec4ec5;
      bVar3 = uVar7 <= uVar8;
      lVar2 = uVar8 - uVar7;
      uVar8 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar3 && lVar2 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)cVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewCache::HaveInputs(const CTransaction& tx) const
{
    if (!tx.IsCoinBase()) {
        for (unsigned int i = 0; i < tx.vin.size(); i++) {
            if (!HaveCoin(tx.vin[i].prevout)) {
                return false;
            }
        }
    }
    return true;
}